

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

int check_if_png(char *fileName,FILE **file)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  uchar buf [8];
  undefined1 local_10 [8];
  
  __stream = fopen(fileName,"rb");
  *file = (FILE *)__stream;
  uVar3 = 0;
  if (__stream != (FILE *)0x0) {
    sVar2 = fread(local_10,1,8,__stream);
    if (sVar2 == 8) {
      iVar1 = png_sig_cmp(local_10,0,8);
      uVar3 = (uint)(iVar1 == 0);
    }
  }
  return uVar3;
}

Assistant:

int check_if_png (const char *fileName, FILE **file)
{
	unsigned char buf[8];
	/* Open the alleged PNG file. */
	if ((*file = fopen(fileName, "rb")) == NULL)
		return NOT_PNG;

	/* Read the first eight bytes and compare them to the signature */
	if (fread(buf, 1, 8, *file) != 8)
		return NOT_PNG;
	return !png_sig_cmp(buf, 0, 8);
}